

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.h
# Opt level: O2

Expression * __thiscall wasm::PossibleContents::makeExpression(PossibleContents *this,Module *wasm)

{
  __index_type _Var1;
  uintptr_t uVar2;
  GlobalGet *pGVar3;
  Global *pGVar4;
  string_view name;
  Literal local_48;
  Builder local_30;
  Builder builder;
  
  _Var1 = *(__index_type *)
           ((long)&(this->value).
                   super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                   .
                   super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                   .
                   super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                   .
                   super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                   .
                   super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                   .
                   super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
           + 0x18);
  if ((byte)(_Var1 - 1) < 2) {
    local_30.wasm = wasm;
    if (_Var1 == '\x01') {
      getLiteral(&local_48,this);
      pGVar3 = (GlobalGet *)Builder::makeConstantExpression(&local_30,&local_48);
      Literal::~Literal(&local_48);
    }
    else {
      name = (string_view)getGlobal(this);
      pGVar4 = Module::getGlobal(wasm,(Name)name);
      uVar2 = (pGVar4->type).id;
      pGVar3 = MixedArena::alloc<wasm::GlobalGet>(&wasm->allocator);
      (pGVar3->name).super_IString.str = name;
      (pGVar3->super_SpecificExpression<(wasm::Expression::Id)10>).super_Expression.type.id = uVar2;
    }
    return (Expression *)pGVar3;
  }
  __assert_fail("canMakeExpression()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/possible-contents.h"
                ,0x121,"Expression *wasm::PossibleContents::makeExpression(Module &)");
}

Assistant:

Expression* makeExpression(Module& wasm) {
    assert(canMakeExpression());
    Builder builder(wasm);
    if (isLiteral()) {
      return builder.makeConstantExpression(getLiteral());
    } else {
      auto name = getGlobal();
      // Note that we load the type from the module, rather than use the type
      // in the GlobalInfo, as that type may not match the global (see comment
      // in the GlobalInfo declaration above).
      return builder.makeGlobalGet(name, wasm.getGlobal(name)->type);
    }
  }